

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2pShaderCompilationCases.cpp
# Opt level: O1

string * deqp::gles2::Performance::strWithWhiteSpaceAndComments
                   (string *__return_storage_ptr__,string *str,deUint32 uniqueNumber)

{
  deUint32 dVar1;
  long *plVar2;
  long *plVar3;
  char cVar4;
  int iVar5;
  long lVar6;
  Random rnd;
  ostringstream s;
  long *local_228;
  long local_218;
  long lStack_210;
  long *local_208;
  long local_200;
  long local_1f8;
  long lStack_1f0;
  int local_1e8;
  deUint32 local_1e4;
  long *local_1e0 [2];
  long local_1d0 [2];
  long local_1c0;
  deRandom local_1b8;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,0x1b32ab9);
  cVar4 = (char)__return_storage_ptr__;
  if ((int)str->_M_string_length < 1) {
    local_1c0 = 1;
  }
  else {
    lVar6 = 0;
    do {
      if ((str->_M_dataplus)._M_p[lVar6] == '\n') break;
      std::__cxx11::string::push_back(cVar4);
      lVar6 = lVar6 + 1;
    } while ((int)lVar6 < (int)str->_M_string_length);
    local_1c0 = (long)((int)lVar6 + 1);
  }
  std::__cxx11::string::push_back(cVar4);
  deRandom_init(&local_1b8,uniqueNumber);
  local_1e4 = uniqueNumber;
  dVar1 = deRandom_getUint32(&local_1b8);
  local_1e8 = (dVar1 - (dVar1 / 0xb + (dVar1 / 0xb) * 10)) + 10;
  iVar5 = 1;
  if (1 < local_1e8) {
    iVar5 = local_1e8;
  }
  do {
    deRandom_getUint32(&local_1b8);
    std::__cxx11::string::push_back(cVar4);
    iVar5 = iVar5 + -1;
  } while (iVar5 != 0);
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
  plVar2 = (long *)std::__cxx11::string::replace((ulong)local_1e0,0,(char *)0x0,0x1c237d7);
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_1f8 = *plVar3;
    lStack_1f0 = plVar2[3];
    local_208 = &local_1f8;
  }
  else {
    local_1f8 = *plVar3;
    local_208 = (long *)*plVar2;
  }
  local_200 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_208);
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_218 = *plVar3;
    lStack_210 = plVar2[3];
    local_228 = &local_218;
  }
  else {
    local_218 = *plVar3;
    local_228 = (long *)*plVar2;
  }
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_228);
  if (local_228 != &local_218) {
    operator_delete(local_228,local_218 + 1);
  }
  if (local_208 != &local_1f8) {
    operator_delete(local_208,local_1f8 + 1);
  }
  if (local_1e0[0] != local_1d0) {
    operator_delete(local_1e0[0],local_1d0[0] + 1);
  }
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
  plVar2 = (long *)std::__cxx11::string::replace((ulong)local_1e0,0,(char *)0x0,0x1c237ea);
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_1f8 = *plVar3;
    lStack_1f0 = plVar2[3];
    local_208 = &local_1f8;
  }
  else {
    local_1f8 = *plVar3;
    local_208 = (long *)*plVar2;
  }
  local_200 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_208);
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_218 = *plVar3;
    lStack_210 = plVar2[3];
    local_228 = &local_218;
  }
  else {
    local_218 = *plVar3;
    local_228 = (long *)*plVar2;
  }
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_228);
  if (local_228 != &local_218) {
    operator_delete(local_228,local_218 + 1);
  }
  if (local_208 != &local_1f8) {
    operator_delete(local_208,local_1f8 + 1);
  }
  if (local_1e0[0] != local_1d0) {
    operator_delete(local_1e0[0],local_1d0[0] + 1);
  }
  iVar5 = 1;
  if (1 < local_1e8) {
    iVar5 = local_1e8;
  }
  do {
    deRandom_getUint32(&local_1b8);
    std::__cxx11::string::push_back(cVar4);
    iVar5 = iVar5 + -1;
  } while (iVar5 != 0);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

static string strWithWhiteSpaceAndComments (const string& str, deUint32 uniqueNumber)
{
	string res("");

	// Find the first newline.
	int firstLineEndNdx = 0;
	while (firstLineEndNdx < (int)str.size() && str[firstLineEndNdx] != '\n')
	{
		res += str[firstLineEndNdx];
		firstLineEndNdx++;
	}
	res += '\n';
	DE_ASSERT(firstLineEndNdx < (int)str.size());

	// Add the whitespaces and comments just after the first line.

	de::Random		rnd		(uniqueNumber);
	int				numWS	= rnd.getInt(10, 20);

	for (int i = 0; i < numWS; i++)
		res += " \t\n"[rnd.getInt(0, 2)];

	res += "/* unique comment " + de::toString(uniqueNumber) + " */\n";
	res += "// unique comment " + de::toString(uniqueNumber) + "\n";

	for (int i = 0; i < numWS; i++)
		res += " \t\n"[rnd.getInt(0, 2)];

	// Add the rest of the string.
	res.append(&str.c_str()[firstLineEndNdx + 1]);

	return res;
}